

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O2

void __thiscall
phmap::priv::anon_unknown_0::Btree_InitializerListInsert_Test::TestBody
          (Btree_InitializerListInsert_Test *this)

{
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
  *val2;
  mapped_type *pmVar1;
  template_ElementType<2UL> *ptVar2;
  long lVar3;
  pointer *__ptr;
  char *pcVar4;
  Message local_e8;
  AssertHelper local_e0;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
  it;
  AssertionResult gtest_ar_7;
  btree_multimap<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_> mmap;
  btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_> map;
  pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>_>
  range;
  string local_68 [32];
  undefined1 local_48 [8];
  btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_> mset;
  btree_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  set;
  
  set.
  super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::priv::StringBtreeDefaultLess,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::priv::StringBtreeDefaultLess,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_*>
        )btree<phmap::priv::set_params<std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,false>>
         ::EmptyNode()::empty_node_abi_cxx11_;
  set.
  super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_>
  .tree_.rightmost_ =
       (node_type *)
       btree<phmap::priv::set_params<std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,false>>
       ::EmptyNode()::empty_node_abi_cxx11_;
  set.
  super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_>
  .tree_.size_ = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&range,"a",(allocator<char> *)&mset);
  std::__cxx11::string::string<std::allocator<char>>(local_68,"b",(allocator<char> *)&map);
  btree<phmap::priv::set_params<std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,false>>
  ::insert_iterator_unique<std::__cxx11::string_const*>
            ((btree<phmap::priv::set_params<std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,false>>
              *)&set,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&range,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  lVar3 = 0x20;
  do {
    std::__cxx11::string::~string(local_68 + lVar3 + -0x20);
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  mset.
  super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        )btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
         ::count_unique<char[2]>
                   ((btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
                     *)&set,(char (*) [2])0x416d2c);
  map.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
  ._M_head_impl._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&range,"set.count(\"a\")","1",(unsigned_long *)&mset,(int *)&map);
  if ((char)range.first.node == '\0') {
    testing::Message::Message((Message *)&mset);
    if (range.first._8_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)range.first._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&map,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x4ce,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&map,(Message *)&mset);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&map);
    if (mset.
        super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .
        super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .tree_.root_.
        super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        .
        super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        .
        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        .
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
         )0x0) {
      (**(code **)(*(long *)mset.
                            super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                            .
                            super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                            .tree_.root_.
                            super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                            .
                            super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                            .
                            super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                            .
                            super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&range.first.position);
  mset.
  super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        )btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
         ::count_unique<char[2]>
                   ((btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
                     *)&set,(char (*) [2])0x415ecb);
  map.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
  ._M_head_impl._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&range,"set.count(\"b\")","1",(unsigned_long *)&mset,(int *)&map);
  if ((char)range.first.node == '\0') {
    testing::Message::Message((Message *)&mset);
    if (range.first._8_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)range.first._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&map,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x4cf,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&map,(Message *)&mset);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&map);
    if (mset.
        super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .
        super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
        .tree_.root_.
        super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        .
        super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        .
        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        .
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
         )0x0) {
      (**(code **)(*(long *)mset.
                            super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                            .
                            super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
                            .tree_.root_.
                            super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                            .
                            super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                            .
                            super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
                            .
                            super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&range.first.position);
  mset.
  super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        )btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>::
         EmptyNode()::empty_node;
  mset.
  super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
  .tree_.rightmost_ =
       (node_type *)
       btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>::
       EmptyNode()::empty_node;
  mset.
  super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_>
  .tree_.size_ = 0;
  range.first.node =
       (btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
        *)&DAT_100000001;
  range.first.position = 4;
  btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>::
  insert_iterator_multi<int_const*>
            ((btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>> *)
             &mset,(int *)&range,(int *)&range.first.field_0xc);
  mmap.
  super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
  .
  super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*,_false>
  ._M_head_impl._0_4_ = 1;
  map.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
        )btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>::
         count_multi<int>((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                           *)&mset,(int *)&mmap);
  it.node = (btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
             *)CONCAT44(it.node._4_4_,2);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&range,"mset.count(1)","2",(unsigned_long *)&map,(int *)&it);
  if ((char)range.first.node == '\0') {
    testing::Message::Message((Message *)&map);
    if (range.first._8_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)range.first._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mmap,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x4d3,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mmap,(Message *)&map);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mmap);
    if (map.
        super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
        .
        super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
        .
        super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
        .tree_.root_.
        super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
        .
        super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
        .
        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
        .
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
         )0x0) {
      (**(code **)(*(long *)map.
                            super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                            .
                            super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                            .
                            super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                            .tree_.root_.
                            super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                            .
                            super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                            .
                            super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                            .
                            super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&range.first.position);
  mmap.
  super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
  .
  super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*,_false>
  ._M_head_impl._0_4_ = 4;
  map.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
        )btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>::
         count_multi<int>((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                           *)&mset,(int *)&mmap);
  it.node = (btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
             *)CONCAT44(it.node._4_4_,1);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&range,"mset.count(4)","1",(unsigned_long *)&map,(int *)&it);
  if ((char)range.first.node == '\0') {
    testing::Message::Message((Message *)&map);
    if (range.first._8_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)range.first._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mmap,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x4d4,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mmap,(Message *)&map);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mmap);
    if (map.
        super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
        .
        super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
        .
        super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
        .tree_.root_.
        super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
        .
        super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
        .
        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
        .
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
         )0x0) {
      (**(code **)(*(long *)map.
                            super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                            .
                            super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                            .
                            super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                            .tree_.root_.
                            super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                            .
                            super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                            .
                            super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                            .
                            super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&range.first.position);
  map.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
        )btree<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
         ::EmptyNode()::empty_node;
  map.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.rightmost_ =
       (node_type *)
       btree<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
       ::EmptyNode()::empty_node;
  map.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.size_ = 0;
  range.first.node =
       (btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
        *)0x500000001;
  range.first.position = 2;
  range.first._12_4_ = 10;
  btree<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
  ::insert_iterator_unique<std::pair<int,int>const*>
            ((btree<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
              *)&map,(pair<int,_int> *)&range,(pair<int,_int> *)&range.second);
  mmap.
  super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
  .
  super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
        )&DAT_f00000003;
  btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_bool>
            *)&range,
           (btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
            *)&map,(value_type *)&mmap);
  mmap.
  super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
  .
  super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*,_false>
  ._M_head_impl._0_4_ = 1;
  pmVar1 = btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
           ::operator[](&map.
                         super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                        ,(key_type *)&mmap);
  it.node = (btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
             *)CONCAT44(it.node._4_4_,5);
  testing::internal::CmpHelperEQ<int,int>((internal *)&range,"map[1]","5",pmVar1,(int *)&it);
  if ((char)range.first.node == '\0') {
    testing::Message::Message((Message *)&mmap);
    if (range.first._8_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)range.first._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&it,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x4da,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&it,(Message *)&mmap);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&it);
    if (mmap.
        super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
        .
        super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
        .
        super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
        .tree_.root_.
        super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
        .
        super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
        .
        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
        .
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
         )0x0) {
      (**(code **)(*(long *)mmap.
                            super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
                            .
                            super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
                            .
                            super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
                            .tree_.root_.
                            super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
                            .
                            super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
                            .
                            super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
                            .
                            super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&range.first.position);
  mmap.
  super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
  .
  super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*,_false>
  ._M_head_impl._0_4_ = 2;
  pmVar1 = btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
           ::operator[](&map.
                         super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                        ,(key_type *)&mmap);
  it.node = (btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
             *)CONCAT44(it.node._4_4_,10);
  testing::internal::CmpHelperEQ<int,int>((internal *)&range,"map[2]","10",pmVar1,(int *)&it);
  if ((char)range.first.node == '\0') {
    testing::Message::Message((Message *)&mmap);
    if (range.first._8_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)range.first._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&it,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x4db,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&it,(Message *)&mmap);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&it);
    if (mmap.
        super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
        .
        super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
        .
        super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
        .tree_.root_.
        super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
        .
        super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
        .
        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
        .
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
         )0x0) {
      (**(code **)(*(long *)mmap.
                            super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
                            .
                            super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
                            .
                            super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
                            .tree_.root_.
                            super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
                            .
                            super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
                            .
                            super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
                            .
                            super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&range.first.position);
  mmap.
  super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
  .
  super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*,_false>
  ._M_head_impl._0_4_ = 3;
  pmVar1 = btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
           ::operator[](&map.
                         super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                        ,(key_type *)&mmap);
  it.node = (btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
             *)CONCAT44(it.node._4_4_,0xf);
  testing::internal::CmpHelperEQ<int,int>((internal *)&range,"map[3]","15",pmVar1,(int *)&it);
  if ((char)range.first.node == '\0') {
    testing::Message::Message((Message *)&mmap);
    if (range.first._8_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)range.first._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&it,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x4dc,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&it,(Message *)&mmap);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&it);
    if (mmap.
        super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
        .
        super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
        .
        super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
        .tree_.root_.
        super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
        .
        super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
        .
        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
        .
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
         )0x0) {
      (**(code **)(*(long *)mmap.
                            super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
                            .
                            super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
                            .
                            super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
                            .tree_.root_.
                            super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
                            .
                            super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
                            .
                            super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
                            .
                            super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&range.first.position);
  mmap.
  super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
  .
  super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_*>
        )btree<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,true>>
         ::EmptyNode()::empty_node;
  mmap.
  super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
  .
  super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
  .tree_.rightmost_ =
       (node_type *)
       btree<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,true>>
       ::EmptyNode()::empty_node;
  mmap.
  super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
  .
  super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
  .tree_.size_ = 0;
  range.first.node =
       (btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
        *)0x500000001;
  range.first.position = 1;
  range.first._12_4_ = 10;
  btree<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,true>>
  ::insert_iterator_multi<std::pair<int,int>const*>
            ((btree<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,true>>
              *)&mmap,(pair<int,_int> *)&range,(pair<int,_int> *)&range.second);
  it.node = (btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
             *)CONCAT44(it.node._4_4_,1);
  btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
  ::equal_range<int>(&range,(btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                             *)&mmap,(int *)&it);
  val2 = &range.second;
  it.node = range.first.node;
  it.position = range.first.position;
  it._12_4_ = range.first._12_4_;
  testing::internal::
  CmpHelperNE<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,true>>,std::pair<int_const,int>&,std::pair<int_const,int>*>,phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,true>>,std::pair<int_const,int>&,std::pair<int_const,int>*>>
            ((internal *)&gtest_ar_7,"it","range.second",&it,val2);
  if (gtest_ar_7.success_ == false) {
    testing::Message::Message(&local_e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_7.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_7.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x4e2,pcVar4);
    testing::internal::AssertHelper::operator=(&local_e0,&local_e8);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_7.message_);
    lVar3 = (long)it.position;
    ptVar2 = btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,true>>
             ::GetField<2ul>((btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,true>>
                              *)it.node);
    local_e8.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 5;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar_7,"it->second","5",&(&ptVar2->value)[lVar3].second,
               (int *)&local_e8);
    if (gtest_ar_7.success_ == false) {
      testing::Message::Message(&local_e8);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_7.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)gtest_ar_7.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x4e3,pcVar4);
      testing::internal::AssertHelper::operator=(&local_e0,&local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      if ((long *)CONCAT44(local_e8.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           local_e8.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_e8.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       local_e8.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_7.message_);
    btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
    ::increment(&it);
    testing::internal::
    CmpHelperNE<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,true>>,std::pair<int_const,int>&,std::pair<int_const,int>*>,phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,true>>,std::pair<int_const,int>&,std::pair<int_const,int>*>>
              ((internal *)&gtest_ar_7,"++it","range.second",&it,val2);
    if (gtest_ar_7.success_ != false) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_7.message_);
      lVar3 = (long)it.position;
      ptVar2 = btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,true>>
               ::GetField<2ul>((btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,true>>
                                *)it.node);
      local_e8.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = 10;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar_7,"it->second","10",&(&ptVar2->value)[lVar3].second,
                 (int *)&local_e8);
      if (gtest_ar_7.success_ == false) {
        testing::Message::Message(&local_e8);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_7.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar_7.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x4e5,pcVar4);
        testing::internal::AssertHelper::operator=(&local_e0,&local_e8);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        if ((long *)CONCAT44(local_e8.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._4_4_,
                             local_e8.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_e8.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._4_4_,
                                         local_e8.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_7.message_);
      btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
      ::increment(&it);
      testing::internal::
      CmpHelperEQ<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,true>>,std::pair<int_const,int>&,std::pair<int_const,int>*>,phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,true>>,std::pair<int_const,int>&,std::pair<int_const,int>*>>
                ((internal *)&gtest_ar_7,"++it","range.second",&it,val2);
      if (gtest_ar_7.success_ == false) {
        testing::Message::Message(&local_e8);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_7.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar_7.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x4e6,pcVar4);
        testing::internal::AssertHelper::operator=(&local_e0,&local_e8);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        if ((long *)CONCAT44(local_e8.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._4_4_,
                             local_e8.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_e8.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._4_4_,
                                         local_e8.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._0_4_) + 8))();
        }
      }
      goto LAB_001a40a7;
    }
    testing::Message::Message(&local_e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_7.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_7.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x4e4,pcVar4);
    testing::internal::AssertHelper::operator=(&local_e0,&local_e8);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_e0);
  if ((long *)CONCAT44(local_e8.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._4_4_,
                       local_e8.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_e8.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._4_4_,
                                   local_e8.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._0_4_) + 8))();
  }
LAB_001a40a7:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_7.message_);
  btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
  ::~btree((btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
            *)&mmap);
  btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  ::~btree((btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
            *)&map);
  btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>::~btree
            ((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
              *)&mset);
  btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
  ::~btree((btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
            *)&set);
  return;
}

Assistant:

size_type count(const key_type &key) const {
        size_type res = checker_.count(key);
        EXPECT_EQ(res, tree_.count(key));
        return res;
    }